

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_post.c
# Opt level: O3

char * nhr_request_create_url_encoded_parameters_POST(nhr_request r,size_t *parameters_len)

{
  char *buff;
  char *mem;
  size_t params_len;
  size_t zgip_parameters_size;
  char content_length [24];
  size_t local_48;
  size_t local_40;
  char local_38 [24];
  
  buff = (char *)0x0;
  local_48 = 0;
  local_40 = 0;
  if (r->parameters == (_nhr_map_node *)0x0) {
    local_48 = 0;
  }
  else {
    buff = nhr_request_url_encoded_parameters(r->parameters,&local_48);
    if (buff == (char *)0x0) {
      local_48 = 0;
      buff = (char *)0x0;
    }
    else {
      if ((r->is_gziped != '\0') || (r->is_deflated != '\0')) {
        mem = (char *)nhr_gz_compress(buff,local_48,&local_40,r->is_gziped != '\0');
        if ((mem == (char *)0x0) || (local_40 == 0)) {
          nhr_free(mem);
        }
        else {
          nhr_free(buff);
          local_48 = local_40;
          buff = mem;
        }
      }
      sprintf(local_38,"%lu",local_48);
      nhr_request_add_header_field(r,k_nhr_content_type,k_nhr_application_x_www_form_urlencoded);
      nhr_request_add_header_field(r,k_nhr_content_length,local_38);
    }
  }
  *parameters_len = local_48;
  return buff;
}

Assistant:

char * nhr_request_create_url_encoded_parameters_POST(nhr_request r, size_t * parameters_len) {
    size_t params_len = 0;
    char content_length[24];
#if defined(NHR_GZIP)
    size_t zgip_parameters_size = 0;
    void * zgip_parameters = NULL;
#endif
    
    char * params = r->parameters ? nhr_request_url_encoded_parameters(r->parameters, &params_len) : NULL;
    if (!params) {
        *parameters_len = 0;
        return NULL;
    }
    
#if defined(NHR_GZIP)
    if (r->is_gziped || r->is_deflated) {
        zgip_parameters = nhr_gz_compress(params, params_len, &zgip_parameters_size, r->is_gziped ? NHR_GZ_METHOD_GZIP : NHR_GZ_METHOD_DEFLATE);
        if (zgip_parameters && zgip_parameters_size) {
            nhr_free(params);
            params_len = zgip_parameters_size;
            params = zgip_parameters;
        } else {
            nhr_free(zgip_parameters);
        }
    }
#endif
    
    nhr_sprintf(content_length, 24, "%lu", (unsigned long)params_len);
    nhr_request_add_header_field(r, k_nhr_content_type, k_nhr_application_x_www_form_urlencoded);
    nhr_request_add_header_field(r, k_nhr_content_length, content_length);
    
    *parameters_len = params_len;
    return params;
}